

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

QTextLayout * __thiscall QTextBlock::layout(QTextBlock *this)

{
  QTextBlockData *block;
  QTextLayout *pQVar1;
  QTextLayout *in_RDI;
  QTextBlockData *b;
  undefined8 in_stack_ffffffffffffffd8;
  QTextLayout *this_00;
  QTextLayout *local_8;
  
  if (((((QFragmentMapData<QTextBlockData> *)&in_RDI->d)->field_0).head == (Header *)0x0) ||
     (*(int *)&((QFragmentMapData<QTextBlockData> *)&in_RDI[1].d)->field_0 == 0)) {
    local_8 = (QTextLayout *)0x0;
  }
  else {
    this_00 = in_RDI;
    QTextDocumentPrivate::blockMap
              ((QTextDocumentPrivate *)
               (((QFragmentMapData<QTextBlockData> *)&in_RDI->d)->field_0).head);
    block = QFragmentMap<QTextBlockData>::fragment
                      ((QFragmentMap<QTextBlockData> *)in_RDI,
                       (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    if (block->layout == (QTextLayout *)0x0) {
      pQVar1 = (QTextLayout *)operator_new(8);
      QTextLayout::QTextLayout(this_00,(QTextBlock *)block);
      block->layout = pQVar1;
    }
    local_8 = block->layout;
  }
  return local_8;
}

Assistant:

QTextLayout *QTextBlock::layout() const
{
    if (!p || !n)
        return nullptr;

    const QTextBlockData *b = p->blockMap().fragment(n);
    if (!b->layout)
        b->layout = new QTextLayout(*this);
    return b->layout;
}